

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2e991::BuildSystemTaskTests_staleFileRemoval_Test::TestBody
          (BuildSystemTaskTests_staleFileRemoval_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  BuildValue *pBVar5;
  reference pvVar6;
  FileSystemReferenceWrapper *this_00;
  element_type *peVar7;
  char *in_R9;
  StringRef SVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e50;
  AssertHelper local_e08;
  Message local_e00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_df8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ddd;
  allocator local_ddc;
  allocator local_ddb;
  allocator local_dda;
  allocator local_dd9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd8;
  string asStack_db8 [32];
  string asStack_d98 [32];
  string asStack_d78 [32];
  iterator local_d58;
  size_type local_d50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d48;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar_4;
  Message local_d18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d10;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cf2;
  allocator local_cf1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  iterator local_cd0;
  size_type local_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cc0;
  undefined1 local_ca8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_c78;
  Message local_c70;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_c68;
  string local_c50;
  bool local_c29;
  undefined1 local_c28 [8];
  AssertionResult gtest_ar__7;
  Message local_c10;
  unsigned_long local_c08;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_c00;
  size_type local_be8;
  undefined1 local_be0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_bb0;
  Message local_ba8;
  bool local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_b68;
  Message local_b60;
  bool local_b51;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_b20 [8];
  Optional<llbuild::buildsystem::BuildValue> result;
  AssertHelper local_a88;
  Message local_a80;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar__4;
  bool local_a51;
  undefined1 auStack_a50 [7];
  bool loadingResult;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_a40
  ;
  BuildSystem local_a38;
  BuildSystem system;
  MockBuildSystemDelegate delegate;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> wrapFS;
  shared_ptr<(anonymous_namespace)::LoggingFileSystem> mockFS;
  undefined1 local_988 [8];
  raw_fd_ostream os_1;
  error_code ec_1;
  Message local_920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_918;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8fc;
  allocator local_8fb;
  allocator local_8fa;
  allocator local_8f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  string asStack_8d8 [32];
  string asStack_8b8 [32];
  iterator local_898;
  size_type local_890;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_888;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_840;
  Message local_838;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_830;
  string local_818;
  bool local_7f1;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar__3;
  Message local_7d8;
  unsigned_long local_7d0;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_7c8;
  size_type local_7b0;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_778;
  Message local_770;
  bool local_761;
  undefined1 local_760 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_6e8 [8];
  Optional<llbuild::buildsystem::BuildValue> result_1;
  string local_668;
  AssertHelper local_648;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_;
  bool local_611;
  undefined1 auStack_610 [7];
  bool loadingResult_1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_600
  ;
  BuildSystem local_5f8;
  BuildSystem system_1;
  MockBuildSystemDelegate delegate_1;
  Twine local_558;
  Twine local_540;
  Twine local_528;
  string local_510;
  StringRef local_4f0;
  undefined1 local_4e0 [8];
  SmallString<256U> builddb;
  undefined1 local_3c0 [8];
  BuildKey keyToBuild;
  undefined1 local_390 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_318;
  Twine local_300;
  Twine local_2e8;
  string local_2d0;
  StringRef local_2b0;
  undefined1 local_2a0 [8];
  SmallString<256U> manifest;
  undefined1 local_180 [8];
  TmpDir tempDir;
  BuildSystemTaskTests_staleFileRemoval_Test *this_local;
  
  tempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_180,stack0xfffffffffffffe70);
  llbuild::TmpDir::str_abi_cxx11_(&local_2d0,(TmpDir *)local_180);
  uVar3 = std::__cxx11::string::data();
  local_2b0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_2b0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_2a0,local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  llvm::Twine::Twine(&local_2e8,"manifest.llbuild");
  llvm::Twine::Twine(&local_300,"");
  llvm::Twine::Twine(&local_318,"");
  llvm::Twine::Twine((Twine *)&ec._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_2a0,&local_2e8,&local_300,&local_318,(Twine *)&ec._M_cat
            );
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2a0);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_390,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x216,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                 );
  }
  llvm::raw_ostream::operator<<
            ((raw_ostream *)local_390,
             "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      description: STALE-FILE-REMOVAL\n      expectedOutputs: [\"a.out\"]\n"
            );
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_390);
  builddb.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       anon_var_dwarf_31436;
  pcVar4 = (char *)strlen("C.1");
  SVar8.Length = (size_t)pcVar4;
  SVar8.Data = pcVar4;
  llbuild::buildsystem::BuildKey::makeCommand
            ((BuildKey *)local_3c0,
             (BuildKey *)
             builddb.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
             _248_8_,SVar8);
  llbuild::TmpDir::str_abi_cxx11_(&local_510,(TmpDir *)local_180);
  uVar3 = std::__cxx11::string::data();
  local_4f0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_4f0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_4e0,local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  llvm::Twine::Twine(&local_528,"build.db");
  llvm::Twine::Twine(&local_540,"");
  llvm::Twine::Twine(&local_558,"");
  llvm::Twine::Twine((Twine *)&delegate_1.trackAllMessages,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_4e0,&local_528,&local_540,&local_558,
             (Twine *)&delegate_1.trackAllMessages);
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&system_1,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&local_5f8,(BuildSystemDelegate *)&system_1,&local_600);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr(&local_600);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_4e0);
  _auStack_610 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    strlen(pcVar4);
  }
  llbuild::buildsystem::BuildSystem::attachDB(&local_5f8,_auStack_610,(string *)0x0);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2a0);
  local_611 = llbuild::buildsystem::BuildSystem::loadDescription
                        (&local_5f8,join_0x00000010_0x00000000_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_611,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_668,(internal *)local_638,(AssertionResult *)"loadingResult","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x22f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    testing::Message::~Message(&local_640);
  }
  result_1.Storage._117_3_ = 0;
  result_1.Storage._116_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  if (result_1.Storage._116_4_ == 0) {
    llbuild::buildsystem::BuildKey::BuildKey
              ((BuildKey *)&gtest_ar__1.message_,(BuildKey *)local_3c0);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8,&local_5f8,
               (BuildKey *)&gtest_ar__1.message_);
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar__1.message_);
    local_719 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                          ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_718,&local_719,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
    if (!bVar1) {
      testing::Message::Message(&local_728);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_718,
                 (AssertionResult *)"result.hasValue()","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_730,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x233,pcVar4);
      testing::internal::AssertHelper::operator=(&local_730,&local_728);
      testing::internal::AssertHelper::~AssertHelper(&local_730);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_728);
    }
    result_1.Storage._117_3_ = 0;
    result_1.Storage._116_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
    if (result_1.Storage._116_4_ == 0) {
      pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                         ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8);
      local_761 = llbuild::buildsystem::BuildValue::isStaleFileRemoval(pBVar5);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_760,&local_761,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
      if (!bVar1) {
        testing::Message::Message(&local_770);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_760,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_778,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x234,pcVar4);
        testing::internal::AssertHelper::operator=(&local_778,&local_770);
        testing::internal::AssertHelper::~AssertHelper(&local_778);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_770);
      }
      result_1.Storage._117_3_ = 0;
      result_1.Storage._116_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
      if (result_1.Storage._116_4_ == 0) {
        pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                           ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8);
        llbuild::buildsystem::BuildValue::getStaleFileList(&local_7c8,pBVar5);
        local_7b0 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size(&local_7c8)
        ;
        local_7d0 = 1;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_7a8,"result.getValue().getStaleFileList().size()","1UL",
                   &local_7b0,&local_7d0);
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_7c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
        if (!bVar1) {
          testing::Message::Message(&local_7d8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x235,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_7d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_7d8);
        }
        result_1.Storage._117_3_ = 0;
        result_1.Storage._116_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
        if (result_1.Storage._116_4_ == 0) {
          pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                             ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8);
          llbuild::buildsystem::BuildValue::getStaleFileList(&local_830,pBVar5);
          pvVar6 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator[]
                             (&local_830,0);
          llvm::StringRef::str_abi_cxx11_(&local_818,pvVar6);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iVar2 = strcmp(pcVar4,"a.out");
          local_7f1 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_7f0,&local_7f1,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_818);
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_830);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
          if (!bVar1) {
            testing::Message::Message(&local_838);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_7f0,
                       (AssertionResult *)
                       "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"a.out\") == 0"
                       ,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_840,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x236,pcVar4);
            testing::internal::AssertHelper::operator=(&local_840,&local_838);
            testing::internal::AssertHelper::~AssertHelper(&local_840);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_838);
          }
          result_1.Storage._117_3_ = 0;
          result_1.Storage._116_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
          if (result_1.Storage._116_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_8f8,"commandPreparing(C.1)",&local_8f9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(asStack_8d8,"commandStarted(C.1)",&local_8fa);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(asStack_8b8,"commandFinished(C.1: 0)",&local_8fb);
            local_898 = &local_8f8;
            local_890 = 3;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_8fc);
            __l_01._M_len = local_890;
            __l_01._M_array = local_898;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_888,__l_01,&local_8fc);
            llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                      (&local_918,(MockBuildSystemDelegate *)&system_1);
            testing::internal::EqHelper::
            Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                      ((EqHelper *)local_870,
                       "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                       ,"delegate.getMessages()",&local_888,&local_918);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_918);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_888);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_8fc);
            local_e50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_898;
            do {
              local_e50 = local_e50 + -1;
              std::__cxx11::string::~string((string *)local_e50);
            } while (local_e50 != &local_8f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_8fb);
            std::allocator<char>::~allocator((allocator<char> *)&local_8fa);
            std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
            if (!bVar1) {
              testing::Message::Message(&local_920);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&ec_1._M_cat,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x23c,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&ec_1._M_cat,&local_920);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ec_1._M_cat);
              testing::Message::~Message(&local_920);
            }
            result_1.Storage._117_3_ = 0;
            result_1.Storage._116_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
            if (result_1.Storage._116_4_ == 0) {
              result_1.Storage._116_4_ = 0;
            }
          }
        }
      }
    }
    llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
              ((Optional<llbuild::buildsystem::BuildValue> *)local_6e8);
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&local_5f8);
  llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&system_1);
  if (result_1.Storage._116_4_ == 0) {
    std::error_code::error_code((error_code *)&os_1.SupportsSeeking);
    SVar8 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2a0);
    llvm::raw_fd_ostream::raw_fd_ostream
              ((raw_fd_ostream *)local_988,SVar8,(error_code *)&os_1.SupportsSeeking,F_Text);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os_1.SupportsSeeking);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!ec",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                    ,0x242,
                    "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                   );
    }
    llvm::raw_ostream::operator<<
              ((raw_ostream *)local_988,
               "\nclient:\n  name: mock\n\ncommands:\n  C.1:\n    tool: stale-file-removal\n    description: STALE-FILE-REMOVAL\n    expectedOutputs: [\"b.out\"]\n"
              );
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_988);
    std::make_shared<(anonymous_namespace)::LoggingFileSystem>();
    this_00 = (FileSystemReferenceWrapper *)operator_new(0x10);
    peVar7 = std::
             __shared_ptr_access<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&wrapFS);
    FileSystemReferenceWrapper::FileSystemReferenceWrapper(this_00,&peVar7->super_FileSystem);
    std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>::
    unique_ptr<std::default_delete<llbuild::basic::FileSystem>,void>
              ((unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>
                *)&delegate.trackAllMessages,(pointer)this_00);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system,true);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    unique_ptr(&local_a40,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&delegate.trackAllMessages);
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&local_a38,(BuildSystemDelegate *)&system,&local_a40);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_a40);
    pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_4e0);
    _auStack_a50 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      strlen(pcVar4);
    }
    llbuild::buildsystem::BuildSystem::attachDB(&local_a38,_auStack_a50,(string *)0x0);
    join_0x00000010_0x00000000_ =
         llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_2a0);
    local_a51 = llbuild::buildsystem::BuildSystem::loadDescription
                          (&local_a38,join_0x00000010_0x00000000_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_a78,&local_a51,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
    if (!bVar1) {
      testing::Message::Message(&local_a80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result.Storage.hasVal,(internal *)local_a78,
                 (AssertionResult *)"loadingResult","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x256,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a88,&local_a80);
      testing::internal::AssertHelper::~AssertHelper(&local_a88);
      std::__cxx11::string::~string((string *)&result.Storage.hasVal);
      testing::Message::~Message(&local_a80);
    }
    result_1.Storage._117_3_ = 0;
    result_1.Storage._116_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
    if (result_1.Storage._116_4_ == 0) {
      llbuild::buildsystem::BuildKey::BuildKey
                ((BuildKey *)&gtest_ar__5.message_,(BuildKey *)local_3c0);
      llbuild::buildsystem::BuildSystem::build
                ((Optional<llbuild::buildsystem::BuildValue> *)local_b20,&local_a38,
                 (BuildKey *)&gtest_ar__5.message_);
      llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar__5.message_);
      local_b51 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                            ((Optional<llbuild::buildsystem::BuildValue> *)local_b20);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_b50,&local_b51,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
      if (!bVar1) {
        testing::Message::Message(&local_b60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__6.message_,(internal *)local_b50,
                   (AssertionResult *)"result.hasValue()","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_b68,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x259,pcVar4);
        testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
        testing::internal::AssertHelper::~AssertHelper(&local_b68);
        std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
        testing::Message::~Message(&local_b60);
      }
      result_1.Storage._117_3_ = 0;
      result_1.Storage._116_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
      if (result_1.Storage._116_4_ == 0) {
        pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                           ((Optional<llbuild::buildsystem::BuildValue> *)local_b20);
        local_b99 = llbuild::buildsystem::BuildValue::isStaleFileRemoval(pBVar5);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_b98,&local_b99,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
        if (!bVar1) {
          testing::Message::Message(&local_ba8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_b98,
                     (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_bb0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x25a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
          testing::internal::AssertHelper::~AssertHelper(&local_bb0);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_ba8);
        }
        result_1.Storage._117_3_ = 0;
        result_1.Storage._116_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
        if (result_1.Storage._116_4_ == 0) {
          pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                             ((Optional<llbuild::buildsystem::BuildValue> *)local_b20);
          llbuild::buildsystem::BuildValue::getStaleFileList(&local_c00,pBVar5);
          local_be8 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size
                                (&local_c00);
          local_c08 = 1;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_be0,"result.getValue().getStaleFileList().size()","1UL",
                     &local_be8,&local_c08);
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_c00);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be0);
          if (!bVar1) {
            testing::Message::Message(&local_c10);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_be0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__7.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x25b,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__7.message_,&local_c10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
            testing::Message::~Message(&local_c10);
          }
          result_1.Storage._117_3_ = 0;
          result_1.Storage._116_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_be0);
          if (result_1.Storage._116_4_ == 0) {
            pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                               ((Optional<llbuild::buildsystem::BuildValue> *)local_b20);
            llbuild::buildsystem::BuildValue::getStaleFileList(&local_c68,pBVar5);
            pvVar6 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::operator[]
                               (&local_c68,0);
            llvm::StringRef::str_abi_cxx11_(&local_c50,pvVar6);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcmp(pcVar4,"b.out");
            local_c29 = iVar2 == 0;
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_c28,&local_c29,(type *)0x0);
            std::__cxx11::string::~string((string *)&local_c50);
            std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_c68);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c28);
            if (!bVar1) {
              testing::Message::Message(&local_c70);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_3.message_,(internal *)local_c28,
                         (AssertionResult *)
                         "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"b.out\") == 0"
                         ,"false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_c78,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x25c,pcVar4);
              testing::internal::AssertHelper::operator=(&local_c78,&local_c70);
              testing::internal::AssertHelper::~AssertHelper(&local_c78);
              std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_c70);
            }
            result_1.Storage._117_3_ = 0;
            result_1.Storage._116_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c28);
            if (result_1.Storage._116_4_ == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_cf0,"a.out",&local_cf1);
              local_cd0 = &local_cf0;
              local_cc8 = 1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_cf2);
              __l_00._M_len = local_cc8;
              __l_00._M_array = local_cd0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_cc0,__l_00,&local_cf2);
              peVar7 = std::
                       __shared_ptr_access<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<(anonymous_namespace)::LoggingFileSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&wrapFS);
              (anonymous_namespace)::LoggingFileSystem::getDeletedPaths_abi_cxx11_
                        (&local_d10,peVar7);
              testing::internal::EqHelper::
              Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                        ((EqHelper *)local_ca8,"std::vector<std::string>({ \"a.out\" })",
                         "mockFS->getDeletedPaths()",&local_cc0,&local_d10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_d10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_cc0);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_cf2);
              local_e90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_cd0;
              do {
                local_e90 = local_e90 + -1;
                std::__cxx11::string::~string((string *)local_e90);
              } while (local_e90 != &local_cf0);
              std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca8);
              if (!bVar1) {
                testing::Message::Message(&local_d18);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ca8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                           ,0x25e,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_4.message_,&local_d18);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_)
                ;
                testing::Message::~Message(&local_d18);
              }
              result_1.Storage._117_3_ = 0;
              result_1.Storage._116_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca8);
              if (result_1.Storage._116_4_ == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_dd8,"commandPreparing(C.1)",&local_dd9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(asStack_db8,"commandStarted(C.1)",&local_dda);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (asStack_d98,"commandNote(C.1) Removed stale file \'a.out\'\n",&local_ddb)
                ;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(asStack_d78,"commandFinished(C.1: 0)",&local_ddc);
                local_d58 = &local_dd8;
                local_d50 = 4;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator(&local_ddd);
                __l._M_len = local_d50;
                __l._M_array = local_d58;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_d48,__l,&local_ddd);
                llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                          (&local_df8,(MockBuildSystemDelegate *)&system);
                testing::internal::EqHelper::
                Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                          ((EqHelper *)local_d30,
                           "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandNote(C.1) Removed stale file \'a.out\'\\n\", \"commandFinished(C.1: 0)\", })"
                           ,"delegate.getMessages()",&local_d48,&local_df8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_df8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_d48);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator(&local_ddd);
                local_ea8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_d58;
                do {
                  local_ea8 = local_ea8 + -1;
                  std::__cxx11::string::~string((string *)local_ea8);
                } while (local_ea8 != &local_dd8);
                std::allocator<char>::~allocator((allocator<char> *)&local_ddc);
                std::allocator<char>::~allocator((allocator<char> *)&local_ddb);
                std::allocator<char>::~allocator((allocator<char> *)&local_dda);
                std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_d30);
                if (!bVar1) {
                  testing::Message::Message(&local_e00);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d30);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_e08,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                             ,0x265,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_e08,&local_e00);
                  testing::internal::AssertHelper::~AssertHelper(&local_e08);
                  testing::Message::~Message(&local_e00);
                }
                result_1.Storage._117_3_ = 0;
                result_1.Storage._116_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
                if (result_1.Storage._116_4_ == 0) {
                  result_1.Storage._116_4_ = 0;
                }
              }
            }
          }
        }
      }
      llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
                ((Optional<llbuild::buildsystem::BuildValue> *)local_b20);
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&local_a38);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                 *)&delegate.trackAllMessages);
    std::shared_ptr<(anonymous_namespace)::LoggingFileSystem>::~shared_ptr
              ((shared_ptr<(anonymous_namespace)::LoggingFileSystem> *)&wrapFS);
  }
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_4e0);
  llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_3c0);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_2a0);
  llbuild::TmpDir::~TmpDir((TmpDir *)local_180);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemoval) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      description: STALE-FILE-REMOVAL
      expectedOutputs: ["a.out"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
    ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "a.out") == 0);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
  C.1:
    tool: stale-file-removal
    description: STALE-FILE-REMOVAL
    expectedOutputs: ["b.out"]
)END";
  }

  auto mockFS = std::make_shared<LoggingFileSystem>();
  std::unique_ptr<FileSystem> wrapFS(new FileSystemReferenceWrapper(*mockFS));
  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, std::move(wrapFS));
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
  ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "b.out") == 0);

  ASSERT_EQ(std::vector<std::string>({ "a.out" }), mockFS->getDeletedPaths());

  ASSERT_EQ(std::vector<std::string>({
    "commandPreparing(C.1)",
    "commandStarted(C.1)",
    "commandNote(C.1) Removed stale file 'a.out'\n",
    "commandFinished(C.1: 0)",
  }), delegate.getMessages());
}